

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryAnimationsLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::LibraryAnimationsLoader::end__sampler(LibraryAnimationsLoader *this)

{
  byte bVar1;
  uint uVar2;
  InterpolationType IVar3;
  int iVar4;
  undefined4 extraout_var;
  UI_STRING *uis;
  UI *ui;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 unaff_retaddr;
  AnimationCurve *in_stack_00000008;
  Severity in_stack_0000005c;
  String *in_stack_00000060;
  ErrorType in_stack_0000006c;
  bool success;
  FloatOrDoubleArray *in_stack_ffffffffffffff90;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  bool local_9;
  
  local_9 = true;
  if ((in_RDI[8].field_2._M_local_buf[0] & 1U) == 0) {
    COLLADAFW::AnimationCurve::getInTangentValues((AnimationCurve *)in_RDI[6]._M_string_length);
    COLLADAFW::FloatOrDoubleArray::clear(in_stack_ffffffffffffff90);
    COLLADAFW::AnimationCurve::getOutTangentValues((AnimationCurve *)in_RDI[6]._M_string_length);
    COLLADAFW::FloatOrDoubleArray::clear(in_stack_ffffffffffffff90);
  }
  uVar2 = FilePartLoader::getObjectFlags((FilePartLoader *)0xc335ed);
  if ((uVar2 & 0x400) != 0) {
    IVar3 = COLLADAFW::AnimationCurve::getInterpolationType
                      ((AnimationCurve *)in_RDI[6]._M_string_length);
    if (IVar3 == INTERPOLATION_UNKNOWN) {
      COLLADAFW::AnimationCurve::setInterpolationType
                ((AnimationCurve *)in_RDI[6]._M_string_length,INTERPOLATION_LINEAR);
    }
    ui = (UI *)(ulong)(in_RDI[8].field_2._M_local_buf[1] & 1);
    iVar4 = COLLADAFW::validate(in_stack_00000008,(bool)unaff_retaddr);
    if (iVar4 == 0) {
      iVar4 = IFilePartLoader::writer((IFilePartLoader *)in_RDI,ui,uis);
      bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x78))
                        ((long *)CONCAT44(extraout_var,iVar4),
                         (IFilePartLoader *)in_RDI[6]._M_string_length);
      local_9 = (bool)(bVar1 & 1);
      if ((IFilePartLoader *)in_RDI[6]._M_string_length != (IFilePartLoader *)0x0) {
        (*(((IFilePartLoader *)in_RDI[6]._M_string_length)->super_ExtraDataLoader).
          _vptr_ExtraDataLoader[1])();
      }
    }
    else {
      COLLADAFW::Animation::getName_abi_cxx11_((Animation *)in_RDI[6]._M_string_length);
      std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::operator+(in_RDI,(char *)in_stack_ffffffffffffff90);
      IFilePartLoader::handleFWLError
                ((IFilePartLoader *)this,in_stack_0000006c,in_stack_00000060,in_stack_0000005c);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
      std::__cxx11::string::~string(local_50);
    }
  }
  in_RDI[6]._M_string_length = 0;
  in_RDI[8]._M_string_length = 0;
  in_RDI[8].field_2._M_local_buf[0] = '\x01';
  return local_9;
}

Assistant:

bool LibraryAnimationsLoader::end__sampler()
	{
		bool success = true;
		if ( !mCurrentAnimationCurveRequiresTangents )
		{
			mCurrentAnimationCurve->getInTangentValues().clear();
			mCurrentAnimationCurve->getOutTangentValues().clear();
		}
		if ( (getObjectFlags() & Loader::ANIMATION_FLAG) != 0 )
		{
			//assume linear interpolation if no interpolation is set
			if ( mCurrentAnimationCurve->getInterpolationType() == COLLADAFW::AnimationCurve::INTERPOLATION_UNKNOWN )
			{
				mCurrentAnimationCurve->setInterpolationType(COLLADAFW::AnimationCurve::INTERPOLATION_LINEAR );
			}

			if ( COLLADAFW::validate( mCurrentAnimationCurve, mVerboseValidate ) == 0)
			{
				success = writer()->writeAnimation(mCurrentAnimationCurve);
				FW_DELETE mCurrentAnimationCurve;
			}
			else
			{
                handleFWLError ( SaxFWLError::ERROR_DATA_NOT_VALID, "Animation curve \"" + mCurrentAnimationCurve->getName () + "\" not valid!" );
			}
		}
		mCurrentAnimationCurve = 0;
		mCurrentAnimationInfo = 0;
		mCurrentAnimationCurveRequiresTangents = true;
		return success;
	}